

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall DifferingTypesTest::nonBasicTypesTest(DifferingTypesTest *this)

{
  size_t shape [2];
  size_t base [2];
  View<MyTestType,_false,_std::allocator<unsigned_long>_> v;
  Marray<MyTestType,_std::allocator<unsigned_long>_> m;
  unsigned_long local_c8 [2];
  unsigned_long local_b8 [3];
  View<MyTestType,_false,_std::allocator<unsigned_long>_> local_a0;
  void *local_60 [2];
  void *local_50;
  long local_38;
  ulong local_30;
  
  local_c8[0] = 3;
  local_c8[1] = 4;
  andres::Marray<MyTestType,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<MyTestType,std::allocator<unsigned_long>> *)local_60,local_c8,local_b8,
             (MyTestType *)&local_a0,&andres::defaultOrder,(allocator_type *)local_b8);
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_c8[0] = 2;
  local_c8[1] = 2;
  local_a0.data_ = (pointer)0x0;
  local_a0.geometry_.shape_ = (size_t *)0x0;
  local_a0.geometry_.shapeStrides_ = (size_t *)0x0;
  local_a0.geometry_.strides_ = (size_t *)0x0;
  local_a0.geometry_.dimension_ = 0;
  local_a0.geometry_.size_ = 0;
  local_a0.geometry_.coordinateOrder_ = LastMajorOrder;
  local_a0.geometry_.isSimple_ = true;
  andres::View<MyTestType,_false,_std::allocator<unsigned_long>_>::testInvariant(&local_a0);
  andres::View<MyTestType,false,std::allocator<unsigned_long>>::view<unsigned_long*,unsigned_long*>
            ((View<MyTestType,false,std::allocator<unsigned_long>> *)local_60,local_b8,local_c8,
             &local_a0);
  andres::View<MyTestType,false,std::allocator<unsigned_long>>::operator()
            ((View<MyTestType,false,std::allocator<unsigned_long>> *)&local_a0,0,1);
  operator_delete(local_a0.geometry_.shape_,local_a0.geometry_.dimension_ * 0x18);
  operator_delete(local_60[0],local_30);
  operator_delete(local_50,local_38 * 0x18);
  return;
}

Assistant:

void DifferingTypesTest::nonBasicTypesTest()
{
    std::size_t shape[] = {3, 4};
    andres::Marray<MyTestType> m(shape, shape + 2);
    std::size_t base[] = {0, 0};
    shape[0] = 2;
    shape[1] = 2;
    andres::View<MyTestType> v = m.view(base, shape);
    v(0, 1) = MyTestType();
}